

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleUnfinishedSections(RunContext *this)

{
  bool bVar1;
  pointer pUVar2;
  pointer pUVar3;
  pointer pUVar4;
  undefined1 local_30 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
  local_28;
  const_reverse_iterator itEnd;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
  local_18;
  const_reverse_iterator it;
  RunContext *this_local;
  
  it.current._M_current =
       (__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
        )(__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
          )this;
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::rbegin((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
            *)&itEnd);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
  ::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
              *)&local_18,
             (reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
              *)&itEnd);
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::rend((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
          *)local_30);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
  ::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
              *)&local_28,
             (reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
              *)local_30);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    pUVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
             ::operator->(&local_18);
    pUVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
             ::operator->(&local_18);
    pUVar4 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
             ::operator->(&local_18);
    (*(this->super_IResultCapture)._vptr_IResultCapture[4])
              (pUVar4->durationInSeconds,this,pUVar2,&pUVar3->prevAssertions);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::clear(&this->m_unfinishedSections);
  return;
}

Assistant:

void handleUnfinishedSections() {
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<UnfinishedSections>::const_reverse_iterator it = m_unfinishedSections.rbegin(),
                        itEnd = m_unfinishedSections.rend();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions, it->durationInSeconds );
            m_unfinishedSections.clear();
        }